

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void encodeImagePackBits(string *path)

{
  uchar uVar1;
  uchar *puVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  char *__filename;
  FILE *__s;
  bool local_111;
  int local_f4;
  int local_f0;
  int k;
  int i_1;
  int pixelCounter;
  FILE *fp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [8];
  string outputPath;
  value_type_conflict1 local_9e [4];
  bool local_9a;
  value_type_conflict1 local_99;
  int local_98;
  bool same;
  byte local_91;
  int i;
  bool first;
  vector<char,_std::allocator<char>_> occurence;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encodedPixels;
  string local_50 [32];
  uchar *local_30;
  uchar *pixelArray;
  int maximum;
  int height;
  int width;
  char pSix [10];
  string *path_local;
  
  maximum = 0;
  pixelArray._4_4_ = 0;
  pixelArray._0_4_ = 0;
  pSix._2_8_ = path;
  std::__cxx11::string::string(local_50,(string *)path);
  puVar2 = readPPM((string *)local_50,(char *)((long)&height + 2),&maximum,
                   (int *)((long)&pixelArray + 4),(int *)&pixelArray);
  std::__cxx11::string::~string(local_50);
  local_30 = puVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&i);
  local_91 = 1;
  for (local_98 = 0;
      SBORROW4(local_98,maximum * pixelArray._4_4_ * 3) !=
      local_98 + maximum * pixelArray._4_4_ * -3 < 0; local_98 = local_98 + 3) {
    if ((local_91 & 1) == 0) {
      uVar1 = local_30[local_98];
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          field_0x10);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x10,sVar3 - 3);
      local_111 = false;
      if (uVar1 == *pvVar4) {
        uVar1 = local_30[local_98 + 1];
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10);
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x10,sVar3 - 2);
        local_111 = false;
        if (uVar1 == *pvVar4) {
          uVar1 = local_30[local_98 + 2];
          sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10);
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,sVar3 - 1);
          local_111 = uVar1 == *pvVar4;
        }
      }
      local_9a = local_111;
      if (local_111 == false) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                   local_30 + local_98);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                   local_30 + (long)local_98 + 1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                   local_30 + (long)local_98 + 2);
        pvVar5 = std::vector<char,_std::allocator<char>_>::back
                           ((vector<char,_std::allocator<char>_> *)&i);
        if ((*pvVar5 < '\0') ||
           (pvVar5 = std::vector<char,_std::allocator<char>_>::back
                               ((vector<char,_std::allocator<char>_> *)&i), *pvVar5 == '\x7f')) {
          local_9e[1] = 0;
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)&i,local_9e + 1);
        }
        else {
          pvVar5 = std::vector<char,_std::allocator<char>_>::back
                             ((vector<char,_std::allocator<char>_> *)&i);
          *pvVar5 = *pvVar5 + '\x01';
        }
      }
      else {
        pvVar5 = std::vector<char,_std::allocator<char>_>::back
                           ((vector<char,_std::allocator<char>_> *)&i);
        if (*pvVar5 < '\x01') {
          pvVar5 = std::vector<char,_std::allocator<char>_>::back
                             ((vector<char,_std::allocator<char>_> *)&i);
          if (*pvVar5 == -0x7f) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                       ,local_30 + local_98);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                       ,local_30 + (long)local_98 + 1);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                       ,local_30 + (long)local_98 + 2);
            local_9e[3] = 0;
            std::vector<char,_std::allocator<char>_>::push_back
                      ((vector<char,_std::allocator<char>_> *)&i,local_9e + 3);
          }
          else {
            pvVar5 = std::vector<char,_std::allocator<char>_>::back
                               ((vector<char,_std::allocator<char>_> *)&i);
            *pvVar5 = *pvVar5 + -1;
          }
        }
        else {
          pvVar5 = std::vector<char,_std::allocator<char>_>::back
                             ((vector<char,_std::allocator<char>_> *)&i);
          *pvVar5 = *pvVar5 + -1;
          local_9e[2] = 0xff;
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)&i,local_9e + 2);
        }
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 local_30 + local_98);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 local_30 + (long)local_98 + 1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 local_30 + (long)local_98 + 2);
      local_99 = '\0';
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)&i,&local_99);
      local_91 = 0;
    }
  }
  local_9e[0] = -0x80;
  std::vector<char,_std::allocator<char>_>::push_back
            ((vector<char,_std::allocator<char>_> *)&i,local_9e);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&fp,(ulong)path);
  std::operator+(local_c0,(char *)&fp);
  std::__cxx11::string::~string((string *)&fp);
  __filename = (char *)std::__cxx11::string::c_str();
  __s = fopen(__filename,"wb");
  fwrite(&maximum,1,4,__s);
  fwrite((void *)((long)&pixelArray + 4),1,4,__s);
  k = 0;
  for (local_f0 = 0;
      sVar3 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)&i), (ulong)(long)local_f0 < sVar3;
      local_f0 = local_f0 + 1) {
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&i,(long)local_f0);
    fwrite(pvVar5,1,1,__s);
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&i,(long)local_f0);
    if ((*pvVar5 < '\0') &&
       (pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)&i,(long)local_f0),
       *pvVar5 != -0x80)) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x10,(long)k);
      fwrite(pvVar4,1,3,__s);
      k = k + 3;
    }
    else {
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)&i,(long)local_f0);
      if (*pvVar5 < '\0') break;
      for (local_f4 = 0;
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)&i,(long)local_f0),
          local_f4 < *pvVar5 + 1; local_f4 = local_f4 + 1) {
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x10,(long)k);
        fwrite(pvVar4,1,3,__s);
        k = k + 3;
      }
    }
  }
  fclose(__s);
  std::__cxx11::string::~string((string *)local_c0);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&i);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &occurence.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return;
}

Assistant:

void encodeImagePackBits(std::string path)
{
    char pSix[10];		// indicates this is a PPM image
    int width = 0;		// width of the image
    int height = 0;		// heigt of the image
    int maximum = 0;	// maximum pixel value

    // read the PPM file and store its contents inside an array and return the pointer to that array to pixelArray
    unsigned char* pixelArray = readPPM(path, pSix, width, height, maximum);
    std::vector <unsigned char> encodedPixels;
    std::vector <char> occurence;

    bool first = true;

    for (int i = 0; i < width * height * 3; i+=3)
    {
        if (first)
        {
            encodedPixels.push_back(pixelArray[i]);
            encodedPixels.push_back(pixelArray[i+1]);
            encodedPixels.push_back(pixelArray[i+2]);
            occurence.push_back(0);
            first = false;
            continue;
        }

        bool same = pixelArray[i] == encodedPixels[encodedPixels.size() - 3]
                    && pixelArray[i+1] == encodedPixels[encodedPixels.size() - 2]
                    && pixelArray[i+2] == encodedPixels[encodedPixels.size() - 1];

        if (same)
        {
            if (occurence.back() <= 0)
            {
                if (occurence.back() == -127)
                {
                    encodedPixels.push_back(pixelArray[i]);
                    encodedPixels.push_back(pixelArray[i+1]);
                    encodedPixels.push_back(pixelArray[i+2]);
                    occurence.push_back(0);
                }
                else
                    occurence.back()--;
            }
            else
            {
                occurence.back()--;
                occurence.push_back(-1);
            }
        }
        else
        {
            encodedPixels.push_back(pixelArray[i]);
            encodedPixels.push_back(pixelArray[i+1]);
            encodedPixels.push_back(pixelArray[i+2]);

            if (occurence.back() < 0 || occurence.back() == 127)
                occurence.push_back(0);
            else
                occurence.back()++;
        }
    }
    occurence.push_back(-128);

    string outputPath = path.substr(0, path.size()-4) + "_packbits.rle";
    FILE *fp = fopen(outputPath.c_str(), "wb");
    fwrite(&width, 1, sizeof(int), fp);
    fwrite(&height, 1, sizeof(int), fp);

    int pixelCounter = 0;
    for (int i = 0; i < occurence.size(); i++)
    {
        fwrite(&occurence[i], 1, 1, fp);
        // if n is negative, we have to  repeat 1 - n times
        if (occurence[i] < 0 && occurence[i] != -128)
        {
            fwrite(&encodedPixels[pixelCounter], 1, 3, fp);
            pixelCounter+=3;
        }
        else if (occurence[i] >= 0)
        {
            for (int k = 0; k < occurence[i] + 1; k++)
            {
                fwrite(&encodedPixels[pixelCounter], 1, 3, fp);
                pixelCounter+=3;
            }
        }
        else
        {
            break;
        }
    }
    fclose(fp);
}